

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

string * __thiscall
Kernel::Term::toString_abi_cxx11_(string *__return_storage_ptr__,Term *this,bool topLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TermList TVar2;
  ulong uVar3;
  long *plVar4;
  ostream *out_00;
  undefined8 *puVar5;
  ulong *puVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  TermList arg2;
  TermList arg1;
  stringstream out;
  string local_230;
  string local_210;
  string *local_1f0;
  anon_union_8_2_f154dc0f_for_Term_10 local_1e8;
  TermList local_1e0;
  string local_1d8;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ios_base local_138 [264];
  
  TVar2 = AtomicSort::superSort();
  if ((Term *)TVar2._content == this) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x79547424;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x6570;
    __return_storage_ptr__->_M_string_length = 6;
    (__return_storage_ptr__->field_2)._M_local_buf[6] = '\0';
    return __return_storage_ptr__;
  }
  uVar9 = this->_functor;
  if (((ulong)uVar9 < 0xfffffff9) && (uVar3 = this->_args[0]._content, (uVar3 & 0x10) == 0)) {
    if ((uVar3 & 0x20) == 0) {
      bVar11 = *(int *)(*(long *)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)uVar9 * 8) + 0x48) != 5;
      goto LAB_005be886;
    }
    if (*(uint *)(DAT_00b521b0 + 0x20c) == uVar9) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      uVar3 = (ulong)(*(uint *)&this->field_0xc & 0xfffffff);
      local_1e0._content = this->_args[uVar3]._content;
      local_1e8 = *(anon_union_8_2_f154dc0f_for_Term_10 *)(this->_args + (uVar3 - 1));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      TermList::toString_abi_cxx11_(&local_1d8,&local_1e0,false);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      paVar1 = &local_230.field_2;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_230.field_2._M_allocated_capacity = *puVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_230.field_2._M_allocated_capacity = *puVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      TermList::toString_abi_cxx11_(&local_210,&local_1e8._sort,false);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        uVar8 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_210._M_string_length + local_230._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          uVar8 = local_210.field_2._M_allocated_capacity;
        }
        if (local_210._M_string_length + local_230._M_string_length <= (ulong)uVar8) {
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_210,0,(char *)0x0,(ulong)local_230._M_dataplus._M_p);
          goto LAB_005bea4a;
        }
      }
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_210._M_dataplus._M_p)
      ;
LAB_005bea4a:
      local_1b8 = &local_1a8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_1a8 = *plVar4;
        uStack_1a0 = puVar5[3];
      }
      else {
        local_1a8 = *plVar4;
        local_1b8 = (long *)*puVar5;
      }
      local_1b0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1b8);
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  bVar11 = false;
LAB_005be886:
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  headToString_abi_cxx11_(&local_230,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  uVar9 = *(uint *)&this->field_0xc & 0xfffffff;
  if (!bVar11 && uVar9 != 0) {
    local_230._M_dataplus._M_p = (pointer)this->_args[uVar9]._content;
    Kernel::operator<<((ostream *)&local_1a8,(TermList *)&local_230);
    local_1f0 = __return_storage_ptr__;
    if (1 < uVar9) {
      iVar10 = uVar9 - 1;
      lVar7 = -1;
      do {
        local_230._M_dataplus._M_p._0_1_ = 0x2c;
        out_00 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(char *)&local_230,1);
        local_230._M_dataplus._M_p =
             (pointer)this->_args[(ulong)(*(uint *)&this->field_0xc & 0xfffffff) + lVar7]._content;
        Kernel::operator<<(out_00,(TermList *)&local_230);
        lVar7 = lVar7 + -1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
    __return_storage_ptr__ = local_1f0;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Term::toString(bool topLevel) const
{
  bool printArgs = true;

  if(isSuper()){
    return "$tType";
  }

  if(!isSpecial() && !isLiteral()){
    if(isSort() && static_cast<AtomicSort*>(const_cast<Term*>(this))->isArrowSort()){
      ASS(arity() == 2);
      std::string res;
      TermList arg1 = *(nthArgument(0));
      TermList arg2 = *(nthArgument(1));
      res += topLevel ? "" : "(";
      res += arg1.toString(false) + " > " + arg2.toString();
      res += topLevel ? "" : ")";
      return res;
    }

    printArgs = isSort() || env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB;
  }

#if NICE_THEORY_OUTPUT
  auto theoryTerm = Kernel::tryNumTraits([&](auto numTraits) {
    using NumTraits = decltype(numTraits);
    auto maybeParMul = [&](auto t) { 
        auto needsPar = t.isTerm() && NumTraits::isAdd(t.term()->functor());
        return t.toString(!needsPar);
      };
    auto uminus = [&]()  {
      std::stringstream out;
      out << "-" << maybeParMul(termArg(0));
      return Option<std::string>(out.str());
    };
    auto binary = [&](auto sym)  {
      auto needsPar = !topLevel;
      auto maybePar = [&](auto t) { 
        return t.toString(
            t.isTerm() && (
              t.term()->functor() == _functor 
              || (NumTraits::isAdd(_functor) && NumTraits::isMul(t.term()->functor()))
              )
            );
      };
      std::stringstream out;
      out << (needsPar ? "(" : "");
      out << maybePar(termArg(0)) << sym << maybePar(termArg(1));
      out << (needsPar ? ")" : "");
      return Option<std::string>(out.str());
    };
    if (isLiteral()) {
      if (NumTraits::isGreater(_functor)) {
        return binary(">");
      } else if (NumTraits::isGeq(_functor)) {
        return binary(">=");
      }
      /* nothing */
    } else if (isSort()) {
      /* nothing */
    } else {
      if (NumTraits::isAdd(_functor)) {
        return binary(" + ");
      } else if (NumTraits::isMul(_functor)) {
        return binary(" ");
      } else if (auto c = NumTraits::tryLinMul(_functor)) {
        return *c == -1 ? some(Output::toString("-", maybeParMul(termArg(0))))
                        : some(Output::toString(*c, " ", maybeParMul(termArg(0))));
      } else if (NumTraits::isFloor(_functor)) {
        return some(Output::toString("⌊", termArg(0), "⌋"));
      } else if (NumTraits::isMinus(_functor)) {
        return uminus();
      }
    }
    /* this means we have an uninterpteted term which will be formatted as usual */
    return Option<std::string>();
  });

  if (theoryTerm.isSome()) {
    return theoryTerm.unwrap();
  }
#endif // NICE_THEORY_OUTPUT

  std::stringstream out;
  out << headToString();
  
  if (_arity && printArgs) {
    out << Output::interleaved(',', anyArgIter(this)) << ")";
  }
  return out.str();
}